

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateShutdownCode
          (MessageGenerator *this,Printer *printer)

{
  FieldGenerator *pFVar1;
  int i_00;
  long lVar2;
  int i;
  long lVar3;
  string sStack_48;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x6b) == '\0') {
    io::Printer::Print(printer,"_$classname$_default_instance_.Shutdown();\n","classname",
                       &this->classname_);
    if (((this->options_).enforce_lite == false) &&
       (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
      SimpleItoa_abi_cxx11_(&sStack_48,(protobuf *)(ulong)(uint)this->index_in_file_messages_,i_00);
      io::Printer::Print(printer,"delete file_level_metadata[$index$].reflection;\n","index",
                         &sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(this->descriptor_ + 0x2c); lVar3 = lVar3 + 1) {
      pFVar1 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar2));
      (*pFVar1->_vptr_FieldGenerator[0x12])(pFVar1,printer);
      lVar2 = lVar2 + 0xa8;
    }
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateShutdownCode(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) return;

  printer->Print("_$classname$_default_instance_.Shutdown();\n", "classname",
                 classname_);

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    printer->Print("delete file_level_metadata[$index$].reflection;\n", "index",
                   SimpleItoa(index_in_file_messages_));
  }

  // Handle default instances of fields.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateShutdownCode(printer);
  }
}